

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

int32_t ucurr_countCurrencyList(UEnumeration *enumerator,UErrorCode *param_2)

{
  int iVar1;
  CurrencyList *pCVar2;
  
  iVar1 = 0;
  pCVar2 = gCurrencyList;
  do {
    pCVar2 = pCVar2 + 1;
    if ((*enumerator->context == 0x7fffffff) || ((*enumerator->context & ~pCVar2[-1].currType) == 0)
       ) {
      iVar1 = iVar1 + 1;
    }
  } while (pCVar2->currency != (char *)0x0);
  return iVar1;
}

Assistant:

static int32_t U_CALLCONV
ucurr_countCurrencyList(UEnumeration *enumerator, UErrorCode * /*pErrorCode*/) {
    UCurrencyContext *myContext = (UCurrencyContext *)(enumerator->context);
    uint32_t currType = myContext->currType;
    int32_t count = 0;

    /* Count the number of items matching the type we are looking for. */
    for (int32_t idx = 0; gCurrencyList[idx].currency != NULL; idx++) {
        if (UCURR_MATCHES_BITMASK(gCurrencyList[idx].currType, currType)) {
            count++;
        }
    }
    return count;
}